

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

GLuint LoadShaders(char *vertex_file_path,char *fragment_file_path)

{
  GLuint GVar1;
  char cVar2;
  GLuint GVar3;
  GLuint GVar4;
  istream *piVar5;
  int InfoLogLength;
  allocator_type local_4e1;
  GLuint local_4e0;
  GLint Result;
  string Line_1;
  char *FragmentSourcePointer;
  string FragmentShaderCode;
  string VertexShaderCode;
  char *VertexSourcePointer;
  ifstream FragmentShaderStream;
  ifstream VertexShaderStream;
  
  local_4e0 = (*__glewCreateShader)(0x8b31);
  GVar3 = (*__glewCreateShader)(0x8b30);
  VertexShaderCode._M_dataplus._M_p = (pointer)&VertexShaderCode.field_2;
  VertexShaderCode._M_string_length = 0;
  VertexShaderCode.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&VertexShaderStream,vertex_file_path,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    GVar4 = 0;
    printf("Impossible to open %s. Are you in the right directory ? Don\'t forget to read the FAQ !\n"
           ,vertex_file_path);
    getchar();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&FragmentShaderStream,"",(allocator<char> *)&FragmentShaderCode);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&VertexShaderStream,(string *)&FragmentShaderStream);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&FragmentShaderCode,"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FragmentShaderStream);
      std::__cxx11::string::append((string *)&VertexShaderCode);
      std::__cxx11::string::~string((string *)&FragmentShaderCode);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&FragmentShaderStream);
    FragmentShaderCode._M_dataplus._M_p = (pointer)&FragmentShaderCode.field_2;
    FragmentShaderCode._M_string_length = 0;
    FragmentShaderCode.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&FragmentShaderStream,fragment_file_path,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&Line_1,"",(allocator<char> *)&VertexSourcePointer);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&FragmentShaderStream,(string *)&Line_1);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &VertexSourcePointer,"\n",&Line_1);
        std::__cxx11::string::append((string *)&FragmentShaderCode);
        std::__cxx11::string::~string((string *)&VertexSourcePointer);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&Line_1);
    }
    Result = 0;
    printf("Compiling shader : %s\n",vertex_file_path);
    GVar4 = local_4e0;
    VertexSourcePointer = VertexShaderCode._M_dataplus._M_p;
    (*__glewShaderSource)(local_4e0,1,&VertexSourcePointer,(GLint *)0x0);
    (*__glewCompileShader)(GVar4);
    (*__glewGetShaderiv)(GVar4,0x8b81,&Result);
    (*__glewGetShaderiv)(GVar4,0x8b84,&InfoLogLength);
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&Line_1,(ulong)(uint)InfoLogLength + 1,
                 (allocator_type *)&FragmentSourcePointer);
      (*__glewGetShaderInfoLog)(local_4e0,InfoLogLength,(GLsizei *)0x0,Line_1._M_dataplus._M_p);
      puts(Line_1._M_dataplus._M_p);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&Line_1);
    }
    printf("Compiling shader : %s\n",fragment_file_path);
    FragmentSourcePointer = FragmentShaderCode._M_dataplus._M_p;
    (*__glewShaderSource)(GVar3,1,&FragmentSourcePointer,(GLint *)0x0);
    (*__glewCompileShader)(GVar3);
    (*__glewGetShaderiv)(GVar3,0x8b81,&Result);
    (*__glewGetShaderiv)(GVar3,0x8b84,&InfoLogLength);
    GVar1 = local_4e0;
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&Line_1,(ulong)(uint)InfoLogLength + 1,
                 &local_4e1);
      (*__glewGetShaderInfoLog)(GVar3,InfoLogLength,(GLsizei *)0x0,Line_1._M_dataplus._M_p);
      puts(Line_1._M_dataplus._M_p);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&Line_1);
    }
    puts("Linking program");
    GVar4 = (*__glewCreateProgram)();
    (*__glewAttachShader)(GVar4,GVar1);
    (*__glewAttachShader)(GVar4,GVar3);
    (*__glewLinkProgram)(GVar4);
    (*__glewGetProgramiv)(GVar4,0x8b82,&Result);
    (*__glewGetProgramiv)(GVar4,0x8b84,&InfoLogLength);
    if (0 < InfoLogLength) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&Line_1,(ulong)(uint)InfoLogLength + 1,
                 &local_4e1);
      (*__glewGetProgramInfoLog)(GVar4,InfoLogLength,(GLsizei *)0x0,Line_1._M_dataplus._M_p);
      puts(Line_1._M_dataplus._M_p);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&Line_1);
    }
    (*__glewDetachShader)(GVar4,GVar1);
    (*__glewDetachShader)(GVar4,GVar3);
    (*__glewDeleteShader)(GVar1);
    (*__glewDeleteShader)(GVar3);
    std::ifstream::~ifstream(&FragmentShaderStream);
    std::__cxx11::string::~string((string *)&FragmentShaderCode);
  }
  std::ifstream::~ifstream(&VertexShaderStream);
  std::__cxx11::string::~string((string *)&VertexShaderCode);
  return GVar4;
}

Assistant:

GLuint LoadShaders(const char * vertex_file_path,const char * fragment_file_path){

	// Create the shaders
	GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
	GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

	// Read the Vertex Shader code from the file
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertex_file_path, std::ios::in);
	if(VertexShaderStream.is_open()){
		std::string Line = "";
		while(getline(VertexShaderStream, Line))
			VertexShaderCode += "\n" + Line;
		VertexShaderStream.close();
	}else{
		printf("Impossible to open %s. Are you in the right directory ? Don't forget to read the FAQ !\n", vertex_file_path);
		getchar();
		return 0;
	}

	// Read the Fragment Shader code from the file
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragment_file_path, std::ios::in);
	if(FragmentShaderStream.is_open()){
		std::string Line = "";
		while(getline(FragmentShaderStream, Line))
			FragmentShaderCode += "\n" + Line;
		FragmentShaderStream.close();
	}

	GLint Result = GL_FALSE;
	int InfoLogLength;


	// Compile Vertex Shader
	printf("Compiling shader : %s\n", vertex_file_path);
	char const * VertexSourcePointer = VertexShaderCode.c_str();
	glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
	glCompileShader(VertexShaderID);

	// Check Vertex Shader
	glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
		printf("%s\n", &VertexShaderErrorMessage[0]);
	}



	// Compile Fragment Shader
	printf("Compiling shader : %s\n", fragment_file_path);
	char const * FragmentSourcePointer = FragmentShaderCode.c_str();
	glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
	glCompileShader(FragmentShaderID);

	// Check Fragment Shader
	glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
		printf("%s\n", &FragmentShaderErrorMessage[0]);
	}



	// Link the program
	printf("Linking program\n");
	GLuint ProgramID = glCreateProgram();
	glAttachShader(ProgramID, VertexShaderID);
	glAttachShader(ProgramID, FragmentShaderID);
	glLinkProgram(ProgramID);

	// Check the program
	glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
	glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> ProgramErrorMessage(InfoLogLength+1);
		glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
		printf("%s\n", &ProgramErrorMessage[0]);
	}

	
	glDetachShader(ProgramID, VertexShaderID);
	glDetachShader(ProgramID, FragmentShaderID);
	
	glDeleteShader(VertexShaderID);
	glDeleteShader(FragmentShaderID);

	return ProgramID;
}